

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O0

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Align
          (Alignment *__return_storage_ptr__,SimdAlignmentEngine<(spoa::Architecture)3> *this,
          char *sequence,uint32_t sequence_len,Graph *graph,int32_t *score)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  invalid_argument *piVar6;
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  *pvVar7;
  size_type sVar8;
  int64_t iVar9;
  uint64_t uVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint64_t in_stack_00000520;
  uint64_t in_stack_00000528;
  uint64_t in_stack_00000530;
  Graph *in_stack_00000538;
  char *in_stack_00000540;
  SimdAlignmentEngine<(spoa::Architecture)3> *in_stack_00000548;
  uint64_t in_stack_00000550;
  Graph *in_stack_00000558;
  char *in_stack_00000560;
  SimdAlignmentEngine<(spoa::Architecture)3> *in_stack_00000568;
  int32_t *in_stack_00000888;
  Graph *in_stack_00000890;
  uint32_t in_stack_0000089c;
  SimdAlignmentEngine<(spoa::Architecture)3> *in_stack_000008a0;
  int32_t *in_stack_000008a8;
  Graph *in_stack_000008b0;
  uint32_t in_stack_000008bc;
  SimdAlignmentEngine<(spoa::Architecture)3> *in_stack_000008c0;
  int32_t *in_stack_00000ae8;
  Graph *in_stack_00000af0;
  uint32_t in_stack_00000afc;
  SimdAlignmentEngine<(spoa::Architecture)3> *in_stack_00000b00;
  int32_t *in_stack_00000b08;
  Graph *in_stack_00000b10;
  uint32_t in_stack_00000b1c;
  SimdAlignmentEngine<(spoa::Architecture)3> *in_stack_00000b20;
  int32_t *in_stack_00001088;
  Graph *in_stack_00001090;
  uint32_t in_stack_0000109c;
  SimdAlignmentEngine<(spoa::Architecture)3> *in_stack_000010a0;
  bad_alloc *ba_1;
  bad_alloc *ba;
  int64_t worst_case_score;
  int32_t *score_local;
  Graph *graph_local;
  uint32_t sequence_len_local;
  char *sequence_local;
  SimdAlignmentEngine<(spoa::Architecture)3> *this_local;
  
  auVar11 = in_ZMM0._0_16_;
  uVar3 = std::numeric_limits<int>::max();
  if (uVar3 < sequence_len) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar6,"[spoa::SimdAlignmentEngine::Align] error: too large sequence!");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar7 = Graph::nodes(graph);
  bVar1 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::empty(pvVar7);
  if ((bVar1) || (sequence_len == 0)) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  pvVar7 = Graph::nodes(graph);
  sVar8 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::size(pvVar7);
  iVar9 = AlignmentEngine::WorstCaseAlignmentScore
                    (&this->super_AlignmentEngine,(ulong)(sequence_len + 8),sVar8);
  iVar4 = std::numeric_limits<int>::min();
  if (iVar9 < iVar4 + 0x400) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar6,"[spoa::SimdAlignmentEngine::Align] error: possible overflow!");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar2 = std::numeric_limits<short>::min();
  if (iVar9 < sVar2 + 0x400) {
    auVar11 = vcvtusi2sd_avx512f(auVar11,sequence_len);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = auVar11._0_8_ * 0.125;
    auVar11 = vroundsd_avx(auVar11,auVar12,10);
    uVar10 = vcvttsd2usi_avx512f(auVar11);
    pvVar7 = Graph::nodes(graph);
    sVar8 = std::
            vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
            ::size(pvVar7);
    uVar5 = Graph::num_codes(graph);
    Realloc(this,uVar10,sVar8 + 1,(uint8_t)uVar5);
    auVar11 = vcvtusi2sd_avx512f(auVar11,sequence_len);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auVar11._0_8_ * 0.125;
    auVar11 = vroundsd_avx(auVar11,auVar13,10);
    vcvttsd2usi_avx512f(auVar11);
    pvVar7 = Graph::nodes(graph);
    std::
    vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
    ::size(pvVar7);
    Initialize<spoa::InstructionSet<(spoa::Architecture)3,int>>
              (in_stack_00000568,in_stack_00000560,in_stack_00000558,in_stack_00000550,
               (uint64_t)in_stack_00000548,(uint64_t)in_stack_00000540);
    if ((this->super_AlignmentEngine).subtype_ == kLinear) {
      Linear<spoa::InstructionSet<(spoa::Architecture)3,int>>
                (in_stack_000008c0,in_stack_000008bc,in_stack_000008b0,in_stack_000008a8);
      return __return_storage_ptr__;
    }
    if ((this->super_AlignmentEngine).subtype_ == kAffine) {
      Affine<spoa::InstructionSet<(spoa::Architecture)3,int>>
                (in_stack_00000b20,in_stack_00000b1c,in_stack_00000b10,in_stack_00000b08);
      return __return_storage_ptr__;
    }
    if ((this->super_AlignmentEngine).subtype_ == kConvex) {
      Convex<spoa::InstructionSet<(spoa::Architecture)3,int>>
                (in_stack_000010a0,in_stack_0000109c,in_stack_00001090,in_stack_00001088);
      return __return_storage_ptr__;
    }
  }
  else {
    auVar11 = vcvtusi2sd_avx512f(auVar11,sequence_len);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar11._0_8_ * 0.0625;
    auVar11 = vroundsd_avx(auVar11,auVar14,10);
    uVar10 = vcvttsd2usi_avx512f(auVar11);
    pvVar7 = Graph::nodes(graph);
    sVar8 = std::
            vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
            ::size(pvVar7);
    uVar5 = Graph::num_codes(graph);
    Realloc(this,uVar10,sVar8 + 1,(uint8_t)uVar5);
    auVar11 = vcvtusi2sd_avx512f(auVar11,sequence_len);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auVar11._0_8_ * 0.0625;
    auVar11 = vroundsd_avx(auVar11,auVar15,10);
    vcvttsd2usi_avx512f(auVar11);
    pvVar7 = Graph::nodes(graph);
    std::
    vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
    ::size(pvVar7);
    Initialize<spoa::InstructionSet<(spoa::Architecture)3,short>>
              (in_stack_00000548,in_stack_00000540,in_stack_00000538,in_stack_00000530,
               in_stack_00000528,in_stack_00000520);
    if ((this->super_AlignmentEngine).subtype_ == kLinear) {
      Linear<spoa::InstructionSet<(spoa::Architecture)3,short>>
                (in_stack_000008a0,in_stack_0000089c,in_stack_00000890,in_stack_00000888);
      return __return_storage_ptr__;
    }
    if ((this->super_AlignmentEngine).subtype_ == kAffine) {
      Affine<spoa::InstructionSet<(spoa::Architecture)3,short>>
                (in_stack_00000b00,in_stack_00000afc,in_stack_00000af0,in_stack_00000ae8);
      return __return_storage_ptr__;
    }
    if ((this->super_AlignmentEngine).subtype_ == kConvex) {
      Convex<spoa::InstructionSet<(spoa::Architecture)3,short>>
                (in_stack_000010a0,in_stack_0000109c,in_stack_00001090,in_stack_00001088);
      return __return_storage_ptr__;
    }
  }
  memset(__return_storage_ptr__,0,0x18);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Align(
    const char* sequence, std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) {
  if (sequence_len > std::numeric_limits<int32_t>::max()) {
    throw std::invalid_argument(
        "[spoa::SimdAlignmentEngine::Align] error: too large sequence!");
  }

  if (graph.nodes().empty() || sequence_len == 0) {
    return Alignment();
  }

#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)

  std::int64_t worst_case_score = WorstCaseAlignmentScore(
      sequence_len + 8,
      graph.nodes().size());

  if (worst_case_score < std::numeric_limits<std::int32_t>::min() + 1024) {
    throw std::invalid_argument(
        "[spoa::SimdAlignmentEngine::Align] error: possible overflow!");
  } else if (worst_case_score < std::numeric_limits<std::int16_t>::min() + 1024) {  // NOLINT
    try {
      Realloc(
          std::ceil(static_cast<double>(sequence_len) / InstructionSet<A, std::int32_t>::kNumVar),  // NOLINT
          graph.nodes().size() + 1,
          graph.num_codes());
    } catch (std::bad_alloc& ba) {
      throw std::invalid_argument(
          "[spoa::SimdAlignmentEngine::Align] error: insufficient memory!");
    }
    Initialize<InstructionSet<A, std::int32_t>>(
        sequence,
        graph,
        sequence_len,
        std::ceil(static_cast<double>(sequence_len) / InstructionSet<A, std::int32_t>::kNumVar),  // NOLINT
        graph.nodes().size() + 1);

    if (subtype_ == AlignmentSubtype::kLinear) {
      return Linear<InstructionSet<A, std::int32_t>>(sequence_len, graph, score);  // NOLINT
    } else if (subtype_ == AlignmentSubtype::kAffine) {
      return Affine<InstructionSet<A, std::int32_t>>(sequence_len, graph, score);  // NOLINT
    } else if (subtype_ == AlignmentSubtype::kConvex) {
      return Convex<InstructionSet<A, std::int32_t>>(sequence_len, graph, score);  // NOLINT
    }
  } else {
    try {
      Realloc(
          std::ceil(static_cast<double>(sequence_len) / InstructionSet<A, std::int16_t>::kNumVar),  // NOLINT
          graph.nodes().size() + 1,
          graph.num_codes());
    } catch (std::bad_alloc& ba) {
      throw std::invalid_argument(
          "[spoa::SimdAlignmentEngine::Align] error: insufficient memory!");
    }
    Initialize<InstructionSet<A, std::int16_t>>(
        sequence,
        graph,
        sequence_len,
        std::ceil(static_cast<double>(sequence_len) / InstructionSet<A, std::int16_t>::kNumVar),  // NOLINT
        graph.nodes().size() + 1);

    if (subtype_ == AlignmentSubtype::kLinear) {
      return Linear<InstructionSet<A, std::int16_t>>(sequence_len, graph, score);  // NOLINT
    } else if (subtype_ == AlignmentSubtype::kAffine) {
      return Affine<InstructionSet<A, std::int16_t>>(sequence_len, graph, score);  // NOLINT
    } else if (subtype_ == AlignmentSubtype::kConvex) {
      return Convex<InstructionSet<A, std::int16_t>>(sequence_len, graph, score);  // NOLINT
    }
  }

#endif
  (void) sequence;
  (void) score;
  return Alignment();
}